

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void timediffFunc(sqlite3_context *context,int NotUsed1,sqlite3_value **argv)

{
  int iVar1;
  long lVar2;
  undefined1 local_b0 [8];
  sqlite3_str sRes;
  DateTime d2;
  DateTime d1;
  uint local_28;
  int M;
  int Y;
  char sign;
  sqlite3_value **argv_local;
  int NotUsed1_local;
  sqlite3_context *context_local;
  
  iVar1 = isDate(context,1,argv,(DateTime *)&d2.validJD);
  if ((iVar1 == 0) && (iVar1 = isDate(context,1,argv + 1,(DateTime *)&sRes.nChar), iVar1 == 0)) {
    computeYMD_HMS((DateTime *)&d2.validJD);
    computeYMD_HMS((DateTime *)&sRes.nChar);
    if ((long)d2._40_8_ < (long)sRes._24_8_) {
      M._3_1_ = '-';
      local_28 = (int)d2.iJD - (int)d1.iJD;
      if (local_28 != 0) {
        d2.iJD._0_4_ = (int)d1.iJD;
        d2.s._0_1_ = 0;
        computeJD((DateTime *)&sRes.nChar);
      }
      d1._44_4_ = d2.iJD._4_4_ - d1.iJD._4_4_;
      if ((int)d1._44_4_ < 0) {
        local_28 = local_28 - 1;
        d1._44_4_ = d1._44_4_ + 0xc;
      }
      if (d1._44_4_ != 0) {
        d2.iJD._4_4_ = d1.iJD._4_4_;
        d2.s._0_1_ = 0;
        computeJD((DateTime *)&sRes.nChar);
      }
      while ((long)sRes._24_8_ < (long)d2._40_8_) {
        d1._44_4_ = d1._44_4_ + -1;
        if ((int)d1._44_4_ < 0) {
          d1._44_4_ = 0xb;
          local_28 = local_28 - 1;
        }
        d2.iJD._4_4_ = d2.iJD._4_4_ + 1;
        if (0xc < d2.iJD._4_4_) {
          d2.iJD._4_4_ = 1;
          d2.iJD._0_4_ = (int)d2.iJD + 1;
        }
        d2.s._0_1_ = 0;
        computeJD((DateTime *)&sRes.nChar);
      }
      lVar2 = sRes._24_8_ - d2._40_8_;
    }
    else {
      M._3_1_ = '+';
      local_28 = (int)d1.iJD - (int)d2.iJD;
      if (local_28 != 0) {
        d2.iJD._0_4_ = (int)d1.iJD;
        d2.s._0_1_ = 0;
        computeJD((DateTime *)&sRes.nChar);
      }
      d1._44_4_ = d1.iJD._4_4_ - d2.iJD._4_4_;
      if ((int)d1._44_4_ < 0) {
        local_28 = local_28 - 1;
        d1._44_4_ = d1._44_4_ + 0xc;
      }
      if (d1._44_4_ != 0) {
        d2.iJD._4_4_ = d1.iJD._4_4_;
        d2.s._0_1_ = 0;
        computeJD((DateTime *)&sRes.nChar);
      }
      while ((long)d2._40_8_ < (long)sRes._24_8_) {
        d1._44_4_ = d1._44_4_ + -1;
        if ((int)d1._44_4_ < 0) {
          d1._44_4_ = 0xb;
          local_28 = local_28 - 1;
        }
        d2.iJD._4_4_ = d2.iJD._4_4_ + -1;
        if (d2.iJD._4_4_ < 1) {
          d2.iJD._4_4_ = 0xc;
          d2.iJD._0_4_ = (int)d2.iJD + -1;
        }
        d2.s._0_1_ = 0;
        computeJD((DateTime *)&sRes.nChar);
      }
      lVar2 = d2._40_8_ - sRes._24_8_;
    }
    d2._40_8_ = lVar2 + 0x873dcf4ec200;
    clearYMD_HMS_TZ((DateTime *)&d2.validJD);
    computeYMD_HMS((DateTime *)&d2.validJD);
    sqlite3StrAccumInit((StrAccum *)local_b0,(sqlite3 *)0x0,(char *)0x0,0,100);
    sqlite3_str_appendf((StrAccum *)local_b0,"%c%04d-%02d-%02d %02d:%02d:%06.3f",d1._24_8_,
                        (ulong)(uint)(int)M._3_1_,(ulong)local_28,(ulong)(uint)d1._44_4_,
                        (ulong)(d1.Y - 1),d1.M,d1.D);
    sqlite3ResultStrAccum(context,(StrAccum *)local_b0);
  }
  return;
}

Assistant:

static void timediffFunc(
  sqlite3_context *context,
  int NotUsed1,
  sqlite3_value **argv
){
  char sign;
  int Y, M;
  DateTime d1, d2;
  sqlite3_str sRes;
  UNUSED_PARAMETER(NotUsed1);
  if( isDate(context, 1, &argv[0], &d1) ) return;
  if( isDate(context, 1, &argv[1], &d2) ) return;
  computeYMD_HMS(&d1);
  computeYMD_HMS(&d2);
  if( d1.iJD>=d2.iJD ){
    sign = '+';
    Y = d1.Y - d2.Y;
    if( Y ){
      d2.Y = d1.Y;
      d2.validJD = 0;
      computeJD(&d2);
    }
    M = d1.M - d2.M;
    if( M<0 ){
      Y--;
      M += 12;
    }
    if( M!=0 ){
      d2.M = d1.M;
      d2.validJD = 0;
      computeJD(&d2);
    }
    while( d1.iJD<d2.iJD ){
      M--;
      if( M<0 ){
        M = 11;
        Y--;
      }
      d2.M--;
      if( d2.M<1 ){
        d2.M = 12;
        d2.Y--;
      }
      d2.validJD = 0;
      computeJD(&d2);
    }
    d1.iJD -= d2.iJD;
    d1.iJD += (u64)1486995408 * (u64)100000;
  }else /* d1<d2 */{
    sign = '-';
    Y = d2.Y - d1.Y;
    if( Y ){
      d2.Y = d1.Y;
      d2.validJD = 0;
      computeJD(&d2);
    }
    M = d2.M - d1.M;
    if( M<0 ){
      Y--;
      M += 12;
    }
    if( M!=0 ){
      d2.M = d1.M;
      d2.validJD = 0;
      computeJD(&d2);
    }
    while( d1.iJD>d2.iJD ){
      M--;
      if( M<0 ){
        M = 11;
        Y--;
      }
      d2.M++;
      if( d2.M>12 ){
        d2.M = 1;
        d2.Y++;
      }
      d2.validJD = 0;
      computeJD(&d2);
    }
    d1.iJD = d2.iJD - d1.iJD;
    d1.iJD += (u64)1486995408 * (u64)100000;
  }
  clearYMD_HMS_TZ(&d1);
  computeYMD_HMS(&d1);
  sqlite3StrAccumInit(&sRes, 0, 0, 0, 100);
  sqlite3_str_appendf(&sRes, "%c%04d-%02d-%02d %02d:%02d:%06.3f",
       sign, Y, M, d1.D-1, d1.h, d1.m, d1.s);
  sqlite3ResultStrAccum(context, &sRes);
}